

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator,
          int recursion_budget)

{
  uint uVar1;
  pointer pUVar2;
  _func_int *p_Var3;
  bool bVar4;
  uint32 uVar5;
  uint64 uVar6;
  string *src;
  _func_int **pp_Var7;
  UnknownFieldSet *unknown_fields_00;
  undefined4 in_register_0000000c;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  UnknownField *this_00;
  char *pcVar8;
  long lVar9;
  long lVar10;
  Hex hex;
  Hex hex_00;
  undefined8 uStack_100;
  CodedInputStream local_f8;
  UnknownFieldSet *local_a8;
  undefined8 local_a0;
  undefined1 auStack_98 [8];
  UnknownFieldSet embedded_unknown_fields;
  string field_number;
  undefined8 local_58;
  
  local_a0 = CONCAT44(in_register_0000000c,recursion_budget);
  lVar9 = 0;
  lVar10 = 0;
  local_a8 = unknown_fields;
  do {
    pUVar2 = (local_a8->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(local_a8->fields_).
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) >> 4) <=
        lVar10) {
      return;
    }
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_f8,*(int *)((long)&pUVar2->number_ + lVar9));
    StrCat_abi_cxx11_((string *)
                      &embedded_unknown_fields.fields_.
                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(protobuf *)&local_f8,a);
    uVar1 = *(uint *)((long)&pUVar2->type_ + lVar9);
    if (uVar1 < 5) {
      this_00 = (UnknownField *)((long)&pUVar2->number_ + lVar9);
      switch(uVar1) {
      case 0:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,
                   embedded_unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,field_number._M_dataplus._M_p)
        ;
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
        uVar6 = UnknownField::varint(this_00);
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_f8,uVar6);
        StrCat_abi_cxx11_((string *)((long)&field_number.field_2 + 8),(protobuf *)&local_f8,a_00);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,field_number.field_2._8_8_,local_58);
        break;
      case 1:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,
                   embedded_unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,field_number._M_dataplus._M_p)
        ;
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": 0x",4);
        uVar5 = UnknownField::fixed32(this_00);
        hex_00.value = (ulong)uVar5;
        hex_00._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_f8,hex_00);
        StrCat_abi_cxx11_((string *)((long)&field_number.field_2 + 8),(protobuf *)&local_f8,a_02);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,field_number.field_2._8_8_,local_58);
        break;
      case 2:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,
                   embedded_unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,field_number._M_dataplus._M_p)
        ;
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": 0x",4);
        uVar6 = UnknownField::fixed64(this_00);
        hex._8_8_ = 0x10;
        hex.value = uVar6;
        strings::AlphaNum::AlphaNum((AlphaNum *)&local_f8,hex);
        StrCat_abi_cxx11_((string *)((long)&field_number.field_2 + 8),(protobuf *)&local_f8,a_01);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,field_number.field_2._8_8_,local_58);
        break;
      case 3:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,
                   embedded_unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,field_number._M_dataplus._M_p)
        ;
        src = UnknownField::length_delimited_abi_cxx11_(this_00);
        local_f8.buffer_ = (uint8 *)(src->_M_dataplus)._M_p;
        local_f8.total_bytes_read_ = (int)src->_M_string_length;
        local_f8.buffer_end_ = local_f8.buffer_ + local_f8.total_bytes_read_;
        local_f8.input_ = (ZeroCopyInputStream *)0x0;
        local_f8.legitimate_message_end_ = false;
        local_f8.aliasing_enabled_ = false;
        local_f8.overflow_bytes_ = 0;
        local_f8.last_tag_ = 0;
        local_f8.buffer_size_after_limit_ = 0;
        local_f8.total_bytes_limit_ = 0x7fffffff;
        local_f8.extension_pool_ = (DescriptorPool *)0x0;
        local_f8.extension_factory_ = (MessageFactory *)0x0;
        embedded_unknown_fields.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8.recursion_budget_ = (int)local_a0;
        auStack_98 = (undefined1  [8])0x0;
        embedded_unknown_fields.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.current_limit_ = local_f8.total_bytes_read_;
        local_f8.recursion_limit_ = local_f8.recursion_budget_;
        if ((local_f8.recursion_budget_ < 1) || (src->_M_string_length == 0)) {
LAB_003122e4:
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": \"",3);
          CEscape((string *)((long)&field_number.field_2 + 8),src);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                    (generator,field_number.field_2._8_8_,local_58);
          std::__cxx11::string::~string((string *)(field_number.field_2._M_local_buf + 8));
          pp_Var7 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
          pcVar8 = "\"\n";
          if (this->single_line_mode_ != false) {
            pcVar8 = "\" ";
          }
        }
        else {
          bVar4 = UnknownFieldSet::ParseFromCodedStream((UnknownFieldSet *)auStack_98,&local_f8);
          if (!bVar4) goto LAB_003122e4;
          p_Var3 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5];
          if (this->single_line_mode_ == true) {
            (*p_Var3)(generator," { ",3);
          }
          else {
            (*p_Var3)(generator," {\n",3);
            (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
          }
          PrintUnknownFields(this,(UnknownFieldSet *)auStack_98,generator,recursion_budget + -1);
          pp_Var7 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
          if (this->single_line_mode_ == true) {
            pp_Var7 = pp_Var7 + 5;
            pcVar8 = "} ";
          }
          else {
            (*pp_Var7[3])(generator);
            pp_Var7 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
            pcVar8 = "}\n";
          }
        }
        (**pp_Var7)(generator,pcVar8,2);
        UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)auStack_98);
        io::CodedInputStream::~CodedInputStream(&local_f8);
        goto LAB_003123c8;
      case 4:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,
                   embedded_unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,field_number._M_dataplus._M_p)
        ;
        p_Var3 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5];
        if (this->single_line_mode_ == true) {
          (*p_Var3)(generator," { ",3);
        }
        else {
          (*p_Var3)(generator," {\n",3);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        }
        unknown_fields_00 = UnknownField::group(this_00);
        PrintUnknownFields(this,unknown_fields_00,generator,recursion_budget + -1);
        pp_Var7 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
        if (this->single_line_mode_ == true) {
          pcVar8 = "} ";
        }
        else {
          (*pp_Var7[3])(generator);
          pp_Var7 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
          pcVar8 = "}\n";
        }
        uStack_100 = 2;
        goto LAB_003123c2;
      }
      std::__cxx11::string::~string((string *)(field_number.field_2._M_local_buf + 8));
      pp_Var7 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
      pcVar8 = "\n";
      if (this->single_line_mode_ != false) {
        pcVar8 = " ";
      }
      uStack_100 = 1;
LAB_003123c2:
      (*pp_Var7[5])(generator,pcVar8,uStack_100);
    }
LAB_003123c8:
    std::__cxx11::string::~string
              ((string *)
               &embedded_unknown_fields.fields_.
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 0x10;
  } while( true );
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator* generator,
    int recursion_budget) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    std::string field_number = StrCat(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator->PrintString(field_number);
        generator->PrintLiteral(": ");
        generator->PrintString(StrCat(field.varint()));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator->PrintString(field_number);
        generator->PrintLiteral(": 0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator->PrintString(field_number);
        generator->PrintLiteral(": 0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator->PrintString(field_number);
        const std::string& value = field.length_delimited();
        // We create a CodedInputStream so that we can adhere to our recursion
        // budget when we attempt to parse the data. UnknownFieldSet parsing is
        // recursive because of groups.
        io::CodedInputStream input_stream(
            reinterpret_cast<const uint8*>(value.data()), value.size());
        input_stream.SetRecursionLimit(recursion_budget);
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && recursion_budget > 0 &&
            embedded_unknown_fields.ParseFromCodedStream(&input_stream)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator->PrintLiteral(" { ");
          } else {
            generator->PrintLiteral(" {\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator,
                             recursion_budget - 1);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message (or we ran out of
          // recursion budget). So it is probably just a plain string.
          generator->PrintLiteral(": \"");
          generator->PrintString(CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator->PrintString(field_number);
        if (single_line_mode_) {
          generator->PrintLiteral(" { ");
        } else {
          generator->PrintLiteral(" {\n");
          generator->Indent();
        }
        // For groups, we recurse without checking the budget. This is OK,
        // because if the groups were too deeply nested then we would have
        // already rejected the message when we originally parsed it.
        PrintUnknownFields(field.group(), generator, recursion_budget - 1);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}